

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

void __thiscall
gui::DialogBox::DialogBox(DialogBox *this,shared_ptr<gui::DialogBoxStyle> *style,String *name)

{
  unsigned_long uVar1;
  undefined8 *in_RDI;
  String *in_stack_ffffffffffffffa8;
  Group *in_stack_ffffffffffffffb0;
  pair<sf::Vector2<float>,_bool> *this_00;
  bool local_2d;
  Vector2<float> local_2c [5];
  
  Group::Group(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_RDI = &PTR__DialogBox_002f72b0;
  in_RDI[4] = &PTR__DialogBox_002f7338;
  std::shared_ptr<gui::DialogBoxStyle>::shared_ptr
            ((shared_ptr<gui::DialogBoxStyle> *)in_stack_ffffffffffffffb0,
             (shared_ptr<gui::DialogBoxStyle> *)in_stack_ffffffffffffffa8);
  *(undefined1 *)(in_RDI + 0x42) = 0;
  sf::Vector2<float>::Vector2((Vector2<float> *)((long)in_RDI + 0x214));
  *(undefined1 *)((long)in_RDI + 0x21c) = 1;
  this_00 = (pair<sf::Vector2<float>,_bool> *)(in_RDI + 0x44);
  sf::Vector2<float>::Vector2(local_2c,0.0,0.0);
  local_2d = false;
  std::pair<sf::Vector2<float>,_bool>::pair<bool,_true>(this_00,local_2c,&local_2d);
  sf::Vector2<float>::Vector2((Vector2<float> *)((long)in_RDI + 0x22c));
  std::shared_ptr<gui::Label>::shared_ptr((shared_ptr<gui::Label> *)0x195a0e);
  std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::vector
            ((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_> *
             )0x195a1f);
  uVar1 = std::numeric_limits<unsigned_long>::max();
  in_RDI[0x4c] = uVar1;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  in_RDI[0x4d] = uVar1;
  *(undefined4 *)(in_RDI + 0x4e) = 1;
  *(undefined4 *)((long)in_RDI + 0x274) = 2;
  return;
}

Assistant:

DialogBox::DialogBox(std::shared_ptr<DialogBoxStyle> style, const sf::String& name) :
    baseClass(name),
    style_(style),
    styleCopied_(false),
    draggable_(true),
    dragPoint_({0.0f, 0.0f}, false),
    submitIndex_(std::numeric_limits<size_t>::max()),
    cancelIndex_(std::numeric_limits<size_t>::max()),
    titleAlignment_(Alignment::center),
    buttonAlignment_(Alignment::right) {
}